

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall icu_63::ModulusSubstitution::toString(ModulusSubstitution *this,UnicodeString *text)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  
  if (this->ruleToUse != (NFRule *)0x0) {
    uVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    uVar2 = 2;
    if ((uVar1 & 1) == 0) {
      uVar2 = uVar1 & 0x1e;
    }
    (text->fUnion).fStackFields.fLengthAndFlags = uVar2;
    iVar3 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])(this);
    UnicodeString::append(text,(char16_t)iVar3);
    iVar3 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])(this);
    UnicodeString::append(text,(char16_t)iVar3);
    iVar3 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])(this);
    UnicodeString::append(text,(char16_t)iVar3);
    return;
  }
  NFSubstitution::toString(&this->super_NFSubstitution,text);
  return;
}

Assistant:

void
ModulusSubstitution::toString(UnicodeString& text) const
{
  // use tokenChar() to get the character at the beginning and
  // end of the substitutin token.  In between them will go
  // either the name of the rule set it uses, or the pattern of
  // the DecimalFormat it uses

  if ( ruleToUse != NULL ) { // Must have been a >>> substitution.
      text.remove();
      text.append(tokenChar());
      text.append(tokenChar());
      text.append(tokenChar());
  } else { // Otherwise just use the super-class function.
	  NFSubstitution::toString(text);
  }
}